

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

MOJOSHADER_irExpression * new_ir_constbool(Context_conflict *ctx,int val)

{
  MOJOSHADER_irExpression *pMVar1;
  
  pMVar1 = (MOJOSHADER_irExpression *)Malloc(ctx,0x60);
  if (pMVar1 != (MOJOSHADER_irExpression *)0x0) {
    (pMVar1->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar1->ir).filename = ctx->sourcefile;
    (pMVar1->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar1 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar1 + 0x1c) = 1;
    (pMVar1->temp).index = val;
  }
  return pMVar1;
}

Assistant:

static MOJOSHADER_irExpression *new_ir_constbool(Context *ctx, const int val)
{
    // !!! FIXME: cache true and false in (ctx), ignore in delete_ir().
    NEW_IR_EXPR(retval, MOJOSHADER_irConstant, MOJOSHADER_IR_CONSTANT, MOJOSHADER_AST_DATATYPE_BOOL, 1);
    retval->value.ival[0] = val;
    return (MOJOSHADER_irExpression *) retval;
}